

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_hdr_core(stbi__write_context *s,int x,int y,int comp,float *data)

{
  int iVar1;
  uchar *scratch;
  long lVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  byte bVar6;
  char header [66];
  char buffer [128];
  
  bVar6 = 0;
  iVar1 = 0;
  if (data != (float *)0x0 && (0 < x && 0 < y)) {
    scratch = (uchar *)malloc((ulong)(uint)(x * 4));
    pcVar4 = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
    pcVar5 = header;
    for (lVar2 = 0x42; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pcVar5 = *pcVar4;
      pcVar4 = pcVar4 + (ulong)bVar6 * -2 + 1;
      pcVar5 = pcVar5 + (ulong)bVar6 * -2 + 1;
    }
    (*s->func)(s->context,header,0x41);
    iVar3 = 0;
    iVar1 = sprintf(buffer,"EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n",(ulong)(uint)y,
                    (ulong)(uint)x);
    (*s->func)(s->context,buffer,iVar1);
    while (y = y + -1, y != -1) {
      iVar1 = y;
      if (stbi__flip_vertically_on_write == 0) {
        iVar1 = iVar3;
      }
      stbiw__write_hdr_scanline(s,x,comp,scratch,data + iVar1 * x * comp * x);
      iVar3 = iVar3 + 1;
    }
    free(scratch);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

static int stbi_write_hdr_core(stbi__write_context *s, int x, int y, int comp, float *data)
{
   if (y <= 0 || x <= 0 || data == NULL)
      return 0;
   else {
      // Each component is stored separately. Allocate scratch space for full output scanline.
      unsigned char *scratch = (unsigned char *) STBIW_MALLOC(x*4);
      int i, len;
      char buffer[128];
      char header[] = "#?RADIANCE\n# Written by stb_image_write.h\nFORMAT=32-bit_rle_rgbe\n";
      s->func(s->context, header, sizeof(header)-1);

#ifdef STBI_MSC_SECURE_CRT
      len = sprintf_s(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#else
      len = sprintf(buffer, "EXPOSURE=          1.0000000000000\n\n-Y %d +X %d\n", y, x);
#endif
      s->func(s->context, buffer, len);

      for(i=0; i < y; i++)
         stbiw__write_hdr_scanline(s, x, comp, scratch, data + comp*x*(stbi__flip_vertically_on_write ? y-1-i : i)*x);
      STBIW_FREE(scratch);
      return 1;
   }
}